

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

Var __thiscall Func::AllocateNumber(Func *this,double value)

{
  Var pvVar1;
  Var number;
  double value_local;
  Func *this_local;
  
  pvVar1 = Js::JavascriptNumber::NewCodeGenInstance(value,(ScriptContext *)0x0);
  return pvVar1;
}

Assistant:

Js::Var
Func::AllocateNumber(double value)
{
    Js::Var number = nullptr;
#if FLOATVAR
    number = Js::JavascriptNumber::NewCodeGenInstance((double)value, nullptr);
#else
    if (!IsOOPJIT()) // in-proc jit
    {
        number = Js::JavascriptNumber::NewCodeGenInstance(GetNumberAllocator(), (double)value, GetScriptContext());
    }
    else // OOP JIT
    {
        number = GetXProcNumberAllocator()->AllocateNumber(this, value);
    }
#endif

    return number;
}